

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void asciidump(void *buf,int len)

{
  ulong uVar1;
  ulong uVar2;
  
  puts("\nASCII dump");
  uVar2 = 0;
  uVar1 = (ulong)(uint)len;
  if (len < 1) {
    uVar1 = uVar2;
  }
  while (uVar1 != uVar2) {
    putc((uint)*(byte *)((long)buf + uVar2),_stdout);
    uVar2 = uVar2 + 1;
    if ((uVar2 & 3) == 0) {
      putchar(0x20);
    }
    if ((uVar2 & 0x1f) == 0) {
      putchar(10);
    }
  }
  putchar(10);
  return;
}

Assistant:

void asciidump(void *buf, int len)
{
        int n;
        unsigned char *p = buf;

        printf("\nASCII dump\n");

        for (n = 0; n < len; n++) {
		putc(p[n], stdout);

                if ((n + 1) % 4 == 0)
                        printf(" ");
                if ((n + 1) % 32 == 0)
                        printf("\n");
        }
        printf("\n");
}